

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O0

Config * ProgramOptions::parseCommandLine(Config *__return_storage_ptr__,int argc,char **argv)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  initializer_list<Config::Size> __l;
  bool bVar1;
  Color CVar2;
  OptionAdder *pOVar3;
  element_type *peVar4;
  size_t sVar5;
  ostream *this_00;
  HelpException *this_01;
  runtime_error *prVar6;
  OptionException *e;
  Size local_17e0;
  Size local_17d8;
  Size local_17d0;
  Size local_17c8;
  Size local_17c0;
  Size local_17b8;
  Size local_17b0;
  Size local_17a8;
  Size local_17a0;
  Size local_1798;
  Size local_1790;
  Size local_1788;
  iterator local_1780;
  undefined8 local_1778;
  vector<Config::Size,_std::allocator<Config::Size>_> local_1770;
  char *local_1758;
  char *local_1750;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1748;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1740;
  char *local_1738;
  char *local_1730;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1728;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1720;
  undefined2 local_1716;
  uint8_t local_1714;
  undefined2 local_1713;
  uint8_t local_1711;
  reference local_1710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_16d0;
  allocator local_1699;
  string local_1698;
  allocator local_1671;
  string local_1670;
  allocator local_1649;
  string local_1648;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1628;
  string local_1608;
  allocator local_15e1;
  string local_15e0;
  undefined1 local_15c0 [8];
  ParseResult result;
  string local_1518;
  allocator local_14f1;
  string local_14f0 [32];
  shared_ptr<cxxopts::Value> local_14d0;
  shared_ptr<cxxopts::Value> local_14c0;
  shared_ptr<const_cxxopts::Value> local_14b0;
  allocator local_1499;
  string local_1498;
  allocator local_1471;
  string local_1470;
  allocator local_1449;
  string local_1448;
  shared_ptr<cxxopts::Value> local_1428;
  shared_ptr<const_cxxopts::Value> local_1418;
  allocator local_1401;
  string local_1400;
  allocator local_13d9;
  string local_13d8;
  allocator local_13b1;
  string local_13b0;
  shared_ptr<cxxopts::Value> local_1390;
  shared_ptr<const_cxxopts::Value> local_1380;
  allocator local_1369;
  string local_1368;
  allocator local_1341;
  string local_1340;
  allocator local_1319;
  string local_1318;
  shared_ptr<cxxopts::Value> local_12f8;
  shared_ptr<const_cxxopts::Value> local_12e8;
  allocator local_12d1;
  string local_12d0;
  allocator local_12a9;
  string local_12a8;
  allocator local_1281;
  string local_1280;
  shared_ptr<cxxopts::Value> local_1260;
  shared_ptr<const_cxxopts::Value> local_1250;
  allocator local_1239;
  string local_1238;
  allocator local_1211;
  string local_1210;
  allocator local_11e9;
  string local_11e8;
  shared_ptr<cxxopts::Value> local_11c8;
  shared_ptr<const_cxxopts::Value> local_11b8;
  allocator local_11a1;
  string local_11a0;
  allocator local_1179;
  string local_1178;
  allocator local_1151;
  string local_1150;
  shared_ptr<cxxopts::Value> local_1130;
  shared_ptr<const_cxxopts::Value> local_1120;
  allocator local_1109;
  string local_1108;
  allocator local_10e1;
  string local_10e0;
  allocator local_10b9;
  string local_10b8;
  shared_ptr<cxxopts::Value> local_1098;
  shared_ptr<const_cxxopts::Value> local_1088;
  allocator local_1071;
  string local_1070;
  allocator local_1049;
  string local_1048;
  shared_ptr<cxxopts::Value> local_1028;
  shared_ptr<const_cxxopts::Value> local_1018;
  allocator local_1001;
  string local_1000;
  allocator local_fd9;
  string local_fd8;
  allocator local_fb1;
  string local_fb0;
  shared_ptr<cxxopts::Value> local_f90;
  shared_ptr<const_cxxopts::Value> local_f80;
  allocator local_f69;
  string local_f68;
  allocator local_f41;
  string local_f40;
  allocator local_f19;
  string local_f18;
  allocator local_ef1;
  string local_ef0 [32];
  shared_ptr<cxxopts::Value> local_ed0;
  shared_ptr<cxxopts::Value> local_ec0;
  shared_ptr<const_cxxopts::Value> local_eb0;
  allocator local_e99;
  string local_e98;
  allocator local_e71;
  string local_e70;
  allocator local_e49;
  string local_e48;
  allocator local_e21;
  string local_e20 [32];
  shared_ptr<cxxopts::Value> local_e00;
  shared_ptr<cxxopts::Value> local_df0;
  shared_ptr<const_cxxopts::Value> local_de0;
  allocator local_dc9;
  string local_dc8;
  allocator local_da1;
  string local_da0;
  allocator local_d79;
  string local_d78;
  shared_ptr<cxxopts::Value> local_d58;
  shared_ptr<const_cxxopts::Value> local_d48;
  allocator local_d31;
  string local_d30;
  allocator local_d09;
  string local_d08;
  allocator local_ce1;
  string local_ce0;
  allocator local_cb9;
  string local_cb8 [32];
  shared_ptr<cxxopts::Value> local_c98;
  shared_ptr<cxxopts::Value> local_c88;
  shared_ptr<const_cxxopts::Value> local_c78;
  allocator local_c61;
  string local_c60;
  allocator local_c39;
  string local_c38;
  allocator local_c11;
  string local_c10;
  allocator local_be9;
  string local_be8 [32];
  shared_ptr<cxxopts::Value> local_bc8;
  shared_ptr<cxxopts::Value> local_bb8;
  shared_ptr<const_cxxopts::Value> local_ba8;
  allocator local_b91;
  string local_b90;
  allocator local_b69;
  string local_b68;
  allocator local_b41;
  string local_b40;
  allocator local_b19;
  string local_b18 [32];
  shared_ptr<cxxopts::Value> local_af8;
  shared_ptr<cxxopts::Value> local_ae8;
  shared_ptr<const_cxxopts::Value> local_ad8;
  allocator local_ac1;
  string local_ac0;
  allocator local_a99;
  string local_a98;
  allocator local_a71;
  string local_a70;
  allocator local_a49;
  string local_a48 [32];
  shared_ptr<cxxopts::Value> local_a28;
  shared_ptr<cxxopts::Value> local_a18;
  shared_ptr<const_cxxopts::Value> local_a08;
  allocator local_9f1;
  string local_9f0;
  allocator local_9c9;
  string local_9c8;
  allocator local_9a1;
  string local_9a0;
  allocator local_979;
  string local_978 [32];
  shared_ptr<cxxopts::Value> local_958;
  shared_ptr<cxxopts::Value> local_948;
  shared_ptr<const_cxxopts::Value> local_938;
  allocator local_921;
  string local_920;
  allocator local_8f9;
  string local_8f8;
  allocator local_8d1;
  string local_8d0;
  allocator local_8a9;
  string local_8a8 [32];
  shared_ptr<cxxopts::Value> local_888;
  shared_ptr<cxxopts::Value> local_878;
  shared_ptr<const_cxxopts::Value> local_868;
  allocator local_851;
  string local_850;
  allocator local_829;
  string local_828;
  allocator local_801;
  string local_800;
  allocator local_7d9;
  string local_7d8 [32];
  shared_ptr<cxxopts::Value> local_7b8;
  shared_ptr<cxxopts::Value> local_7a8;
  shared_ptr<const_cxxopts::Value> local_798;
  allocator local_781;
  string local_780;
  allocator local_759;
  string local_758;
  allocator local_731;
  string local_730;
  shared_ptr<cxxopts::Value> local_710;
  shared_ptr<const_cxxopts::Value> local_700;
  allocator local_6e9;
  string local_6e8;
  allocator local_6c1;
  string local_6c0;
  allocator local_699;
  string local_698 [32];
  shared_ptr<cxxopts::Value> local_678;
  shared_ptr<cxxopts::Value> local_668;
  shared_ptr<const_cxxopts::Value> local_658;
  allocator local_641;
  string local_640;
  allocator local_619;
  string local_618;
  allocator local_5f1;
  string local_5f0;
  shared_ptr<cxxopts::Value> local_5d0;
  shared_ptr<const_cxxopts::Value> local_5c0;
  allocator local_5a9;
  string local_5a8;
  allocator local_581;
  string local_580;
  shared_ptr<cxxopts::Value> local_560;
  shared_ptr<const_cxxopts::Value> local_550;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  shared_ptr<cxxopts::Value> local_4f0;
  shared_ptr<const_cxxopts::Value> local_4e0;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  shared_ptr<cxxopts::Value> local_458;
  shared_ptr<const_cxxopts::Value> local_448;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  OptionAdder local_3c0;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  undefined1 local_348 [8];
  Options options;
  string textureNameSuffix;
  string kerningPairs;
  string dataFormat;
  undefined1 local_168 [8];
  string textureSizeListOptionName;
  undefined1 local_140 [8];
  string charsOptionName;
  undefined1 local_118 [8];
  string charsFileOptionName;
  allocator local_e1;
  undefined1 local_e0 [8];
  string backgroundColorOptionName;
  string backgroundColor;
  string textureSizeList;
  string color;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  charsFile;
  string chars;
  char **argv_local;
  int argc_local;
  Config *config;
  
  Config::Config(__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)
             &charsFile.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&color.field_2 + 8));
  std::__cxx11::string::string((string *)(textureSizeList.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(backgroundColor.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(backgroundColorOptionName.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e0,"background-color",&local_e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"chars-file",
             (allocator *)(charsOptionName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(charsOptionName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"chars",
             (allocator *)(textureSizeListOptionName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(textureSizeListOptionName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_168,"texture-size",(allocator *)(dataFormat.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(dataFormat.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(kerningPairs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(textureNameSuffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&options.m_option_map._M_h._M_single_bucket);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"fontbm",&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_390,"Command line bitmap font generator, compatible with bmfont",
             &local_391);
  cxxopts::Options::Options((Options *)local_348,&local_368,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"",&local_3e1);
  cxxopts::Options::add_options(&local_3c0,(Options *)local_348,&local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"help",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"produce help message",&local_431);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_448,&local_458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"",&local_479);
  pOVar3 = cxxopts::OptionAdder::operator()(&local_3c0,&local_408,&local_430,&local_448,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"font-file",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"path to ttf file, required",&local_4c9);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_4f0,&__return_storage_ptr__->fontFile);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_4e0,&local_4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"",&local_511);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_4a0,&local_4c8,&local_4e0,&local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,
             "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if \'chars-file\' option is not defined"
             ,&local_539);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_560,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &charsFile.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_550,&local_560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"",&local_581);
  pOVar3 = cxxopts::OptionAdder::operator()
                     (pOVar3,(string *)local_140,&local_538,&local_550,&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,
             "optional path to UTF-8 text file with required characters (will be combined with \'chars\' option)"
             ,&local_5a9);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cxxopts *)&local_5d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&color.field_2 + 8));
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_5c0,&local_5d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"",&local_5f1);
  pOVar3 = cxxopts::OptionAdder::operator()
                     (pOVar3,(string *)local_118,&local_5a8,&local_5c0,&local_5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,"color",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_640,
             "foreground RGB color, for example: 32,255,255, default value is 255,255,255",
             &local_641);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_678,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&textureSizeList.field_2 + 8));
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"255,255,255",&local_699);
  (*peVar4->_vptr_Value[10])(&local_668,peVar4,local_698);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_658,&local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"",&local_6c1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_618,&local_640,&local_658,&local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6e8,
             "background color RGB color, for example: 0,0,128, transparent by default",&local_6e9);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_710,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&backgroundColorOptionName.field_2 + 8));
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_700,&local_710);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_730,"",&local_731);
  pOVar3 = cxxopts::OptionAdder::operator()
                     (pOVar3,(string *)local_e0,&local_6e8,&local_700,&local_730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"font-size",&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,"font size, default value is 32",&local_781);
  cxxopts::value<unsigned_short>((cxxopts *)&local_7b8,&__return_storage_ptr__->fontSize);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"32",&local_7d9);
  (*peVar4->_vptr_Value[10])(&local_7a8,peVar4,local_7d8);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_798,&local_7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_800,"",&local_801);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_758,&local_780,&local_798,&local_800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_828,"padding-up",&local_829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_850,"padding up, default value is 0",&local_851);
  cxxopts::value<unsigned_int>((cxxopts *)&local_888,&(__return_storage_ptr__->padding).up);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a8,"0",&local_8a9);
  (*peVar4->_vptr_Value[10])(&local_878,peVar4,local_8a8);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_868,&local_878);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d0,"",&local_8d1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_828,&local_850,&local_868,&local_8d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f8,"padding-right",&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_920,"padding right, default value is 0",&local_921);
  cxxopts::value<unsigned_int>((cxxopts *)&local_958,&(__return_storage_ptr__->padding).right);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"0",&local_979);
  (*peVar4->_vptr_Value[10])(&local_948,peVar4,local_978);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_938,&local_948);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9a0,"",&local_9a1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_8f8,&local_920,&local_938,&local_9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9c8,"padding-down",&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9f0,"padding down, default value is 0",&local_9f1);
  cxxopts::value<unsigned_int>((cxxopts *)&local_a28,&(__return_storage_ptr__->padding).down);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_a28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"0",&local_a49);
  (*peVar4->_vptr_Value[10])(&local_a18,peVar4,local_a48);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_a08,&local_a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a70,"",&local_a71);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_9c8,&local_9f0,&local_a08,&local_a70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a98,"padding-left",&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ac0,"padding left, default value is 0",&local_ac1);
  cxxopts::value<unsigned_int>((cxxopts *)&local_af8,&(__return_storage_ptr__->padding).left);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_af8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b18,"0",&local_b19);
  (*peVar4->_vptr_Value[10])(&local_ae8,peVar4,local_b18);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_ad8,&local_ae8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b40,"",&local_b41);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_a98,&local_ac0,&local_ad8,&local_b40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b68,"spacing-vert",&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b90,"spacing vert, default value is 0",&local_b91);
  cxxopts::value<unsigned_int>((cxxopts *)&local_bc8,&(__return_storage_ptr__->spacing).ver);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_bc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be8,"0",&local_be9);
  (*peVar4->_vptr_Value[10])(&local_bb8,peVar4,local_be8);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_ba8,&local_bb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c10,"",&local_c11);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_b68,&local_b90,&local_ba8,&local_c10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c38,"spacing-horiz",&local_c39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c60,"spacing horiz, default value is 0",&local_c61);
  cxxopts::value<unsigned_int>((cxxopts *)&local_c98,&(__return_storage_ptr__->spacing).hor);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_c98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"0",&local_cb9);
  (*peVar4->_vptr_Value[10])(&local_c88,peVar4,local_cb8);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_c78,&local_c88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ce0,"",&local_ce1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_c38,&local_c60,&local_c78,&local_ce0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d08,"output",&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d30,"output files name without extension, required",&local_d31);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_d58,&__return_storage_ptr__->output);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_d48,&local_d58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d78,"",&local_d79);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_d08,&local_d30,&local_d48,&local_d78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_da0,"data-format",&local_da1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_dc8,
             "output data file format: \"txt\", \"xml\", \"json\", \"bin\", \"cbor\", default: \"txt\""
             ,&local_dc9);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_e00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&kerningPairs.field_2 + 8));
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_e00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"txt",&local_e21);
  (*peVar4->_vptr_Value[10])(&local_df0,peVar4,local_e20);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_de0,&local_df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e48,"",&local_e49);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_da0,&local_dc8,&local_de0,&local_e48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e70,"kerning-pairs",&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e98,
             "\"generate kerning pairs: \"disabled\", \"basic\", \"regular\" (tuned by hinter), \"extended\" (bigger output size, but more precise), default: \"disabled\""
             ,&local_e99);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_ed0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&textureNameSuffix.field_2 + 8));
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_ed0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ef0,"disabled",&local_ef1);
  (*peVar4->_vptr_Value[10])(&local_ec0,peVar4,local_ef0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_eb0,&local_ec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f18,"",&local_f19);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_e70,&local_e98,&local_eb0,&local_f18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f40,"monochrome",&local_f41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f68,"disable anti-aliasing",&local_f69);
  cxxopts::value<bool>((cxxopts *)&local_f90,&__return_storage_ptr__->monochrome);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_f80,&local_f90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fb0,"",&local_fb1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_f40,&local_f68,&local_f80,&local_fb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fd8,"extra-info",&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1000,"write extra information to data file",&local_1001);
  cxxopts::value<bool>((cxxopts *)&local_1028,&__return_storage_ptr__->extraInfo);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1018,&local_1028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1048,"",&local_1049);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_fd8,&local_1000,&local_1018,&local_1048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1070,
             "list of texture sizes (will be tried from left to right to fit glyphs)",&local_1071);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_1098,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&backgroundColor.field_2 + 8));
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1088,&local_1098);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10b8,"",&local_10b9);
  pOVar3 = cxxopts::OptionAdder::operator()
                     (pOVar3,(string *)local_168,&local_1070,&local_1088,&local_10b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10e0,"texture-crop-width",&local_10e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1108,"crop unused parts of output textures (width)",&local_1109);
  cxxopts::value<bool>((cxxopts *)&local_1130,&__return_storage_ptr__->cropTexturesWidth);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1120,&local_1130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1150,"",&local_1151);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_10e0,&local_1108,&local_1120,&local_1150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1178,"texture-crop-height",&local_1179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_11a0,"crop unused parts of output textures (height)",&local_11a1);
  cxxopts::value<bool>((cxxopts *)&local_11c8,&__return_storage_ptr__->cropTexturesHeight);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_11b8,&local_11c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11e8,"",&local_11e9);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_1178,&local_11a0,&local_11b8,&local_11e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1210,"align-horiz",&local_1211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1238,"align glyph horizontal position",&local_1239);
  cxxopts::value<unsigned_int>((cxxopts *)&local_1260,&(__return_storage_ptr__->alignment).hor);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1250,&local_1260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1280,"",&local_1281);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_1210,&local_1238,&local_1250,&local_1280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12a8,"align-vert",&local_12a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12d0,"align glyph vertical position",&local_12d1);
  cxxopts::value<unsigned_int>((cxxopts *)&local_12f8,&(__return_storage_ptr__->alignment).ver);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_12e8,&local_12f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1318,"",&local_1319);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_12a8,&local_12d0,&local_12e8,&local_1318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1340,"verbose",&local_1341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1368,"verbose output",&local_1369);
  cxxopts::value<bool>((cxxopts *)&local_1390,&__return_storage_ptr__->verbose);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1380,&local_1390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13b0,"",&local_13b1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_1340,&local_1368,&local_1380,&local_13b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13d8,"max-texture-count",&local_13d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1400,"maximum generated textures",&local_1401);
  cxxopts::value<unsigned_int>((cxxopts *)&local_1428,&__return_storage_ptr__->maxTextureCount);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1418,&local_1428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1448,"",&local_1449);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_13d8,&local_1400,&local_1418,&local_1448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1470,"texture-name-suffix",&local_1471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1498,
             "texture name suffix: \"index_aligned\", \"index\", \"none\", default: \"index_aligned\""
             ,&local_1499);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_14d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &options.m_option_map._M_h._M_single_bucket);
  peVar4 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_14d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14f0,"index_aligned",&local_14f1);
  (*peVar4->_vptr_Value[10])(&local_14c0,peVar4,local_14f0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_14b0,&local_14c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1518,"",
             (allocator *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::OptionAdder::operator()(pOVar3,&local_1470,&local_1498,&local_14b0,&local_1518);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.m_unmatched.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_14b0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_14c0);
  std::__cxx11::string::~string(local_14f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_14d0);
  std::__cxx11::string::~string((string *)&local_1498);
  std::allocator<char>::~allocator((allocator<char> *)&local_1499);
  std::__cxx11::string::~string((string *)&local_1470);
  std::allocator<char>::~allocator((allocator<char> *)&local_1471);
  std::__cxx11::string::~string((string *)&local_1448);
  std::allocator<char>::~allocator((allocator<char> *)&local_1449);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1418);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1428);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator((allocator<char> *)&local_1401);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13d9);
  std::__cxx11::string::~string((string *)&local_13b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13b1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1380);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1390);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator((allocator<char> *)&local_1369);
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator((allocator<char> *)&local_1341);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator((allocator<char> *)&local_1319);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_12e8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_12f8);
  std::__cxx11::string::~string((string *)&local_12d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d1);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a9);
  std::__cxx11::string::~string((string *)&local_1280);
  std::allocator<char>::~allocator((allocator<char> *)&local_1281);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1250);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1260);
  std::__cxx11::string::~string((string *)&local_1238);
  std::allocator<char>::~allocator((allocator<char> *)&local_1239);
  std::__cxx11::string::~string((string *)&local_1210);
  std::allocator<char>::~allocator((allocator<char> *)&local_1211);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_11b8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_11c8);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
  std::__cxx11::string::~string((string *)&local_1178);
  std::allocator<char>::~allocator((allocator<char> *)&local_1179);
  std::__cxx11::string::~string((string *)&local_1150);
  std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1120);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1130);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1088);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1098);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1018);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1028);
  std::__cxx11::string::~string((string *)&local_1000);
  std::allocator<char>::~allocator((allocator<char> *)&local_1001);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_f80);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_f90);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::__cxx11::string::~string((string *)&local_f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_f41);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_f19);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_eb0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_ec0);
  std::__cxx11::string::~string(local_ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_ed0);
  std::__cxx11::string::~string((string *)&local_e98);
  std::allocator<char>::~allocator((allocator<char> *)&local_e99);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  std::__cxx11::string::~string((string *)&local_e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_e49);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_de0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_df0);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_e00);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
  std::__cxx11::string::~string((string *)&local_da0);
  std::allocator<char>::~allocator((allocator<char> *)&local_da1);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_d79);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_d48);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_d58);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::__cxx11::string::~string((string *)&local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_c78);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_c88);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_c98);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  std::__cxx11::string::~string((string *)&local_c38);
  std::allocator<char>::~allocator((allocator<char> *)&local_c39);
  std::__cxx11::string::~string((string *)&local_c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_c11);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_ba8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_bb8);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_bc8);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_b41);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_ad8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_ae8);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_af8);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::__cxx11::string::~string((string *)&local_a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_a08);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_a18);
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_a28);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_938);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_948);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_958);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_868);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_878);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_888);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator((allocator<char> *)&local_829);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_798);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_7a8);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_7b8);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_700);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_710);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_658);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_668);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_678);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_5c0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_5d0);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_550);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_560);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_4e0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_4f0);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_448);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_458);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  cxxopts::OptionAdder::~OptionAdder(&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  cxxopts::Options::parse((ParseResult *)local_15c0,(Options *)local_348,argc,argv);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15e0,"help",&local_15e1);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,&local_15e0);
  std::__cxx11::string::~string((string *)&local_15e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e1);
  if (sVar5 != 0) {
    local_1628.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1628.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1628.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1628);
    cxxopts::Options::help(&local_1608,(Options *)local_348,&local_1628);
    this_00 = std::operator<<((ostream *)&std::cout,(string *)&local_1608);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1608);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1628);
    this_01 = (HelpException *)__cxa_allocate_exception(8);
    *this_01 = (HelpException)0x0;
    HelpException::HelpException(this_01);
    __cxa_throw(this_01,&HelpException::typeinfo,HelpException::~HelpException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1648,"font-file",&local_1649);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,&local_1648);
  std::__cxx11::string::~string((string *)&local_1648);
  std::allocator<char>::~allocator((allocator<char> *)&local_1649);
  if (sVar5 == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"--font-file required");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1670,"output",&local_1671);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,&local_1670);
  std::__cxx11::string::~string((string *)&local_1670);
  std::allocator<char>::~allocator((allocator<char> *)&local_1671);
  if (sVar5 == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"--output required");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1698,"max-texture-count",&local_1699);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,&local_1698);
  __return_storage_ptr__->useMaxTextureCount = sVar5 != 0;
  std::__cxx11::string::~string((string *)&local_1698);
  std::allocator<char>::~allocator((allocator<char> *)&local_1699);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,(string *)local_140);
  if ((sVar5 == 0) &&
     (sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,(string *)local_118), sVar5 == 0
     )) {
    std::__cxx11::string::operator=
              ((string *)
               &charsFile.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"32-126");
  }
  std::__cxx11::string::string
            ((string *)&__range2,
             (string *)
             &charsFile.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  parseCharsString(&local_16d0,(string *)&__range2);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->chars,&local_16d0);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_16d0);
  std::__cxx11::string::~string((string *)&__range2);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,(string *)local_118);
  if (sVar5 != 0) {
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&color.field_2 + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this);
    f = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&f), bVar1) {
      local_1710 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
      getCharsFromFile(local_1710,&__return_storage_ptr__->chars);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  CVar2 = parseColor((string *)((long)&textureSizeList.field_2 + 8));
  local_1713 = CVar2._0_2_;
  local_1711 = CVar2.b;
  (__return_storage_ptr__->color).b = local_1711;
  (__return_storage_ptr__->color).r = (char)local_1713;
  (__return_storage_ptr__->color).g = (char)((ushort)local_1713 >> 8);
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,(string *)local_e0);
  __return_storage_ptr__->backgroundTransparent = sVar5 == 0;
  if ((__return_storage_ptr__->backgroundTransparent & 1U) == 0) {
    CVar2 = parseColor((string *)((long)&backgroundColorOptionName.field_2 + 8));
    local_1716 = CVar2._0_2_;
    local_1714 = CVar2.b;
    (__return_storage_ptr__->backgroundColor).r = (char)local_1716;
    (__return_storage_ptr__->backgroundColor).g = (char)((ushort)local_1716 >> 8);
    (__return_storage_ptr__->backgroundColor).b = local_1714;
  }
  local_1720._M_current = (char *)std::__cxx11::string::begin();
  local_1728._M_current = (char *)std::__cxx11::string::end();
  local_1730 = (char *)std::__cxx11::string::begin();
  local_1738 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                 (local_1720,local_1728,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_1730,tolower);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&kerningPairs.field_2 + 8),"txt");
  if (bVar1) {
    __return_storage_ptr__->dataFormat = Text;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&kerningPairs.field_2 + 8),"xml");
    if (bVar1) {
      __return_storage_ptr__->dataFormat = Xml;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&kerningPairs.field_2 + 8),"bin");
      if (bVar1) {
        __return_storage_ptr__->dataFormat = Bin;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&kerningPairs.field_2 + 8),"json");
        if (bVar1) {
          __return_storage_ptr__->dataFormat = Json;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&kerningPairs.field_2 + 8),"cbor");
          if (!bVar1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"unknown --data-format value");
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          __return_storage_ptr__->dataFormat = Cbor;
        }
      }
    }
  }
  local_1740._M_current = (char *)std::__cxx11::string::begin();
  local_1748._M_current = (char *)std::__cxx11::string::end();
  local_1750 = (char *)std::__cxx11::string::begin();
  local_1758 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                 (local_1740,local_1748,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_1750,tolower);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&textureNameSuffix.field_2 + 8),"disabled");
  if (bVar1) {
    __return_storage_ptr__->kerningPairs = Disabled;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&textureNameSuffix.field_2 + 8),"basic");
    if (bVar1) {
      __return_storage_ptr__->kerningPairs = Basic;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&textureNameSuffix.field_2 + 8),"regular");
      if (bVar1) {
        __return_storage_ptr__->kerningPairs = Regular;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&textureNameSuffix.field_2 + 8),"extended");
        if (!bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"unknown --kerning-pairs value");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __return_storage_ptr__->kerningPairs = Extended;
      }
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &options.m_option_map._M_h._M_single_bucket,"index_aligned");
  if (bVar1) {
    __return_storage_ptr__->textureNameSuffix = IndexAligned;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &options.m_option_map._M_h._M_single_bucket,"index");
    if (bVar1) {
      __return_storage_ptr__->textureNameSuffix = Index;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &options.m_option_map._M_h._M_single_bucket,"none");
      if (!bVar1) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"unknown --texture-name-suffix value");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __return_storage_ptr__->textureNameSuffix = None;
    }
  }
  sVar5 = cxxopts::ParseResult::count((ParseResult *)local_15c0,(string *)local_168);
  if (sVar5 == 0) {
    Config::Size::Size((Size *)&e,0x20,0x20);
    Config::Size::Size(&local_17e0,0x40,0x20);
    Config::Size::Size(&local_17d8,0x40,0x40);
    Config::Size::Size(&local_17d0,0x80,0x40);
    Config::Size::Size(&local_17c8,0x80,0x80);
    Config::Size::Size(&local_17c0,0x100,0x80);
    Config::Size::Size(&local_17b8,0x100,0x100);
    Config::Size::Size(&local_17b0,0x200,0x100);
    Config::Size::Size(&local_17a8,0x200,0x200);
    Config::Size::Size(&local_17a0,0x400,0x200);
    Config::Size::Size(&local_1798,0x400,0x400);
    Config::Size::Size(&local_1790,0x800,0x400);
    Config::Size::Size(&local_1788,0x800,0x800);
    local_1780 = (iterator)&e;
    local_1778 = 0xd;
    __l._M_len = 0xd;
    __l._M_array = local_1780;
    std::vector<Config::Size,_std::allocator<Config::Size>_>::operator=
              (&__return_storage_ptr__->textureSizeList,__l);
  }
  else {
    parseTextureSize(&local_1770,(string *)((long)&backgroundColor.field_2 + 8));
    std::vector<Config::Size,_std::allocator<Config::Size>_>::operator=
              (&__return_storage_ptr__->textureSizeList,&local_1770);
    std::vector<Config::Size,_std::allocator<Config::Size>_>::~vector(&local_1770);
  }
  if ((__return_storage_ptr__->alignment).hor == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"invalid --align-horiz");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((__return_storage_ptr__->alignment).ver == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"invalid --align-vert");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cxxopts::ParseResult::~ParseResult((ParseResult *)local_15c0);
  cxxopts::Options::~Options((Options *)local_348);
  std::__cxx11::string::~string((string *)&options.m_option_map._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)(textureNameSuffix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(kerningPairs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)(backgroundColorOptionName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(backgroundColor.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(textureSizeList.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&color.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &charsFile.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Config ProgramOptions::parseCommandLine(int argc, char* argv[])
{
    try
    {
        Config config;
        std::string chars;
        std::vector<std::string> charsFile;
        std::string color;
        std::string textureSizeList;
        std::string backgroundColor;
        const std::string backgroundColorOptionName = "background-color";
        const std::string charsFileOptionName = "chars-file";
        const std::string charsOptionName = "chars";
        const std::string textureSizeListOptionName = "texture-size";
        std::string dataFormat;
        std::string kerningPairs;
        std::string textureNameSuffix;

        cxxopts::Options options("fontbm", "Command line bitmap font generator, compatible with bmfont");
        options.add_options()
            ("help", "produce help message")
            ("font-file", "path to ttf file, required", cxxopts::value<std::string>(config.fontFile))
            (charsOptionName, "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if 'chars-file' option is not defined", cxxopts::value<std::string>(chars))
            (charsFileOptionName, "optional path to UTF-8 text file with required characters (will be combined with 'chars' option)", cxxopts::value<std::vector<std::string>>(charsFile))
            ("color", "foreground RGB color, for example: 32,255,255, default value is 255,255,255", cxxopts::value<std::string>(color)->default_value("255,255,255"))
            (backgroundColorOptionName, "background color RGB color, for example: 0,0,128, transparent by default", cxxopts::value<std::string>(backgroundColor))
            ("font-size", "font size, default value is 32", cxxopts::value<std::uint16_t>(config.fontSize)->default_value("32"))
            ("padding-up", "padding up, default value is 0", cxxopts::value<std::uint32_t>(config.padding.up)->default_value("0"))
            ("padding-right", "padding right, default value is 0", cxxopts::value<std::uint32_t>(config.padding.right)->default_value("0"))
            ("padding-down", "padding down, default value is 0", cxxopts::value<std::uint32_t>(config.padding.down)->default_value("0"))
            ("padding-left", "padding left, default value is 0", cxxopts::value<std::uint32_t>(config.padding.left)->default_value("0"))
            ("spacing-vert", "spacing vert, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.ver)->default_value("0"))
            ("spacing-horiz", "spacing horiz, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.hor)->default_value("0"))
            ("output", "output files name without extension, required", cxxopts::value<std::string>(config.output))
            ("data-format", R"(output data file format: "txt", "xml", "json", "bin", "cbor", default: "txt")", cxxopts::value<std::string>(dataFormat)->default_value("txt"))
            ("kerning-pairs", R"("generate kerning pairs: "disabled", "basic", "regular" (tuned by hinter), "extended" (bigger output size, but more precise), default: "disabled")", cxxopts::value<std::string>(kerningPairs)->default_value("disabled"))
            ("monochrome", "disable anti-aliasing", cxxopts::value<bool>(config.monochrome))
            ("extra-info", "write extra information to data file", cxxopts::value<bool>(config.extraInfo))
            (textureSizeListOptionName, "list of texture sizes (will be tried from left to right to fit glyphs)", cxxopts::value<std::string>(textureSizeList))
            ("texture-crop-width", "crop unused parts of output textures (width)", cxxopts::value<bool>(config.cropTexturesWidth))
            ("texture-crop-height", "crop unused parts of output textures (height)", cxxopts::value<bool>(config.cropTexturesHeight))
            ("align-horiz", "align glyph horizontal position", cxxopts::value<std::uint32_t>(config.alignment.hor))
            ("align-vert", "align glyph vertical position", cxxopts::value<std::uint32_t>(config.alignment.ver))
            ("verbose", "verbose output", cxxopts::value<bool>(config.verbose))
            ("max-texture-count", "maximum generated textures", cxxopts::value<std::uint32_t>(config.maxTextureCount))
            ("texture-name-suffix", R"(texture name suffix: "index_aligned", "index", "none", default: "index_aligned")", cxxopts::value<std::string>(textureNameSuffix)->default_value("index_aligned"))
            ;

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            throw HelpException();
        }

        if (!result.count("font-file"))
            throw std::runtime_error("--font-file required");
        if (!result.count("output"))
            throw std::runtime_error("--output required");

        config.useMaxTextureCount = result.count("max-texture-count");

        if (!result.count(charsOptionName) && !result.count(charsFileOptionName))
            chars = "32-126";
        config.chars = parseCharsString(chars);
        if (result.count(charsFileOptionName))
            for (const auto& f : charsFile)
                getCharsFromFile(f, config.chars);

        config.color = parseColor(color);
        config.backgroundTransparent = result.count(backgroundColorOptionName) == 0;
        if (!config.backgroundTransparent)
            config.backgroundColor = parseColor(backgroundColor);

        std::transform(dataFormat.begin(), dataFormat.end(), dataFormat.begin(), tolower);

        if (dataFormat == "txt")
            config.dataFormat = Config::DataFormat::Text;
        else if (dataFormat == "xml")
            config.dataFormat = Config::DataFormat::Xml;
        else if (dataFormat == "bin")
            config.dataFormat = Config::DataFormat::Bin;
        else if (dataFormat == "json")
            config.dataFormat = Config::DataFormat::Json;
        else if (dataFormat == "cbor")
            config.dataFormat = Config::DataFormat::Cbor;
        else
            throw std::runtime_error("unknown --data-format value");

        std::transform(kerningPairs.begin(), kerningPairs.end(), kerningPairs.begin(), tolower);
        if (kerningPairs == "disabled")
            config.kerningPairs = Config::KerningPairs::Disabled;
        else if (kerningPairs == "basic")
            config.kerningPairs = Config::KerningPairs::Basic;
        else if (kerningPairs == "regular")
            config.kerningPairs = Config::KerningPairs::Regular;
        else if (kerningPairs == "extended")
            config.kerningPairs = Config::KerningPairs::Extended;
        else
            throw std::runtime_error("unknown --kerning-pairs value");

        if (textureNameSuffix == "index_aligned")
            config.textureNameSuffix = Config::TextureNameSuffix::IndexAligned;
        else if (textureNameSuffix == "index")
            config.textureNameSuffix = Config::TextureNameSuffix::Index;
        else if (textureNameSuffix == "none")
            config.textureNameSuffix = Config::TextureNameSuffix::None;
        else
            throw std::runtime_error("unknown --texture-name-suffix value");

        if (result.count(textureSizeListOptionName))
            config.textureSizeList = parseTextureSize(textureSizeList);
        else
            config.textureSizeList = {
                {32, 32},
                {64, 32},
                {64, 64},
                {128, 64},
                {128, 128},
                {256, 128},
                {256, 256},
                {512, 256},
                {512, 512},
                {1024, 512},
                {1024, 1024},
                {2048, 1024},
                {2048, 2048}
        };

        if (!config.alignment.hor)
            throw std::runtime_error("invalid --align-horiz");
        if (!config.alignment.ver)
            throw std::runtime_error("invalid --align-vert");

        return config;
    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        throw std::exception();
    }
}